

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::Metadata::_InternalSerialize
          (Metadata *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *pvVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  undefined8 *puVar3;
  void *pvVar4;
  ulong uVar5;
  size_type i;
  ulong uVar6;
  size_t __n;
  const_iterator it;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  puVar3 = (undefined8 *)((ulong)(this->shortdescription_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar3[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,(int)lVar2,SERIALIZE,"CoreML.Specification.Metadata.shortDescription"
              );
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->shortdescription_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe),target);
  }
  puVar3 = (undefined8 *)((ulong)(this->versionstring_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar3[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,(int)lVar2,SERIALIZE,"CoreML.Specification.Metadata.versionString");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(string *)
                                 ((ulong)(this->versionstring_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe),target);
  }
  puVar3 = (undefined8 *)((ulong)(this->author_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar3[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,(int)lVar2,SERIALIZE,"CoreML.Specification.Metadata.author");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,3,(string *)
                                 ((ulong)(this->author_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  puVar3 = (undefined8 *)((ulong)(this->license_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2 = puVar3[1];
  if (lVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,(int)lVar2,SERIALIZE,"CoreML.Specification.Metadata.license");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,4,(string *)
                                 ((ulong)(this->license_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  uVar5 = (this->userdefined_).map_.elements_.num_elements_;
  if (uVar5 != 0) {
    local_48.m_ = (InnerMap *)&this->userdefined_;
    if ((uVar5 == 1) || (stream->is_serialization_deterministic_ == false)) {
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::SearchFrom(&local_48,(this->userdefined_).map_.elements_.index_of_first_non_null_);
      local_68.m_ = local_48.m_;
      local_68.node_ = local_48.node_;
      while (local_68.node_ != (Node *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                 ::InternalSerialize(100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_68.node_,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(local_68.node_)->field_0x20,target,stream);
        _InternalSerialize(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)::
        string_>_const__(&(local_68.node_)->kv);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InnerMap::
        iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&local_68);
      }
    }
    else {
      pvVar4 = operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 << 3);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::InnerMap::
      iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::SearchFrom(&local_48,(this->userdefined_).map_.elements_.index_of_first_non_null_);
      uVar5 = 0;
      local_68.m_ = local_48.m_;
      local_68.node_ = local_48.node_;
      while (local_68.node_ != (Node *)0x0) {
        *(Node **)((long)pvVar4 + uVar5 * 8) = local_68.node_;
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::InnerMap::
        iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&local_68);
        uVar5 = uVar5 + 1;
      }
      if (uVar5 != 0) {
        pvVar1 = (void *)((long)pvVar4 + uVar5 * 8);
        lVar2 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        std::
        __introsort_loop<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const*>>>
                  (pvVar4,pvVar1,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const*>>>
                  (pvVar4,pvVar1);
        uVar6 = 0;
        do {
          key = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 ((long)pvVar4 + uVar6 * 8);
          target = google::protobuf::internal::
                   MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                   ::InternalSerialize(100,key,key + 1,target,stream);
          _InternalSerialize(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)::
          string_>_const__(*(ConstPtr *)((long)pvVar4 + uVar6 * 8));
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      operator_delete__(pvVar4);
    }
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    pvVar4 = *(void **)((uVar5 & 0xfffffffffffffffc) + 8);
    uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar5 & 1) == 0) {
      puVar3 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar3 = (undefined8 *)((uVar5 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar3[1];
    if ((long)stream->end_ - (long)target < (long)__n) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar4,(int)puVar3[1],target);
    }
    else {
      memcpy(target,pvVar4,__n);
      target = target + __n;
    }
  }
  return target;
}

Assistant:

uint8_t* Metadata::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.Metadata)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // string shortDescription = 1;
  if (!this->_internal_shortdescription().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_shortdescription().data(), static_cast<int>(this->_internal_shortdescription().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.shortDescription");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_shortdescription(), target);
  }

  // string versionString = 2;
  if (!this->_internal_versionstring().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_versionstring().data(), static_cast<int>(this->_internal_versionstring().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.versionString");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_versionstring(), target);
  }

  // string author = 3;
  if (!this->_internal_author().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_author().data(), static_cast<int>(this->_internal_author().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.author");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_author(), target);
  }

  // string license = 4;
  if (!this->_internal_license().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_license().data(), static_cast<int>(this->_internal_license().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.license");
    target = stream->WriteStringMaybeAliased(
        4, this->_internal_license(), target);
  }

  // map<string, string> userDefined = 100;
  if (!this->_internal_userdefined().empty()) {
    typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, std::string >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::PROTOBUF_NAMESPACE_ID::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        (void)p;
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), static_cast<int>(p->first.length()),
          ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.key");
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
          p->second.data(), static_cast<int>(p->second.length()),
          ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.value");
      }
    };

    if (stream->IsSerializationDeterministic() &&
        this->_internal_userdefined().size() > 1) {
      ::std::unique_ptr<SortItem[]> items(
          new SortItem[this->_internal_userdefined().size()]);
      typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, std::string >::size_type size_type;
      size_type n = 0;
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, std::string >::const_iterator
          it = this->_internal_userdefined().begin();
          it != this->_internal_userdefined().end(); ++it, ++n) {
        items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());
      for (size_type i = 0; i < n; i++) {
        target = Metadata_UserDefinedEntry_DoNotUse::Funcs::InternalSerialize(100, items[static_cast<ptrdiff_t>(i)]->first, items[static_cast<ptrdiff_t>(i)]->second, target, stream);
        Utf8Check::Check(&(*items[static_cast<ptrdiff_t>(i)]));
      }
    } else {
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, std::string >::const_iterator
          it = this->_internal_userdefined().begin();
          it != this->_internal_userdefined().end(); ++it) {
        target = Metadata_UserDefinedEntry_DoNotUse::Funcs::InternalSerialize(100, it->first, it->second, target, stream);
        Utf8Check::Check(&(*it));
      }
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.Metadata)
  return target;
}